

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O1

void __thiscall TestOutput::printFailure(TestOutput *this,TestFailure *failure)

{
  bool bVar1;
  SimpleString local_20;
  
  bVar1 = TestFailure::isOutsideTestFile(failure);
  if (!bVar1) {
    bVar1 = TestFailure::isInHelperFunction(failure);
    if (!bVar1) {
      printFileAndLineForFailure(this,failure);
      goto LAB_001a56e5;
    }
  }
  printFileAndLineForTestAndFailure(this,failure);
LAB_001a56e5:
  (*failure->_vptr_TestFailure[6])(&local_20,failure);
  printFailureMessage(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

void TestOutput::printFailure(const TestFailure& failure)
{
    if (failure.isOutsideTestFile() || failure.isInHelperFunction())
        printFileAndLineForTestAndFailure(failure);
    else
        printFileAndLineForFailure(failure);

    printFailureMessage(failure.getMessage());
}